

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relu_test.cc
# Opt level: O0

void intgemm::kernel_relu_test<(intgemm::CPUType)4,signed_char>(void)

{
  longlong alVar1 [8];
  vector_t<CPUType::AVX512BW,_int> input_00;
  ulong uVar2;
  char *pcVar3;
  char *__last;
  longlong (*palVar4) [8];
  size_t sVar5;
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  AssertionHandler catchAssertionHandler;
  size_t i;
  AlignedVector<signed_char> output;
  AlignedVector<signed_char> input;
  int VECTOR_LENGTH;
  undefined1 auVar8 [24];
  undefined1 in_stack_fffffffffffffd00 [64];
  ExprLhs<const_signed_char_&> *in_stack_fffffffffffffd40;
  undefined1 local_240 [56];
  undefined8 in_stack_fffffffffffffdf8;
  undefined8 uVar9;
  undefined1 in_stack_fffffffffffffe00 [32];
  SourceLineInfo local_170;
  StringRef local_160;
  ulong local_108;
  undefined1 local_100 [64];
  AlignedVector<signed_char> local_78;
  AlignedVector<signed_char> local_68;
  undefined4 local_54;
  
  auVar8 = in_stack_fffffffffffffd00._8_24_;
  if (3 < kCPU) {
    local_54 = 0x40;
    AlignedVector<signed_char>::AlignedVector
              (in_stack_fffffffffffffd00._24_8_,in_stack_fffffffffffffd00._16_8_,
               in_stack_fffffffffffffd00._8_8_);
    AlignedVector<signed_char>::AlignedVector(auVar8._16_8_,auVar8._8_8_,auVar8._0_8_);
    pcVar3 = AlignedVector<signed_char>::begin(&local_68);
    __last = AlignedVector<signed_char>::end(&local_68);
    std::iota<signed_char*,signed_char>(pcVar3,__last,-0x20);
    palVar4 = AlignedVector<signed_char>::as<long_long__vector(8)>(&local_68);
    auVar6 = vmovdqa64_avx512f((undefined1  [64])*palVar4);
    local_100 = vmovdqa64_avx512f(auVar6);
    auVar7 = vmovdqa64_avx512f(local_100);
    auVar6 = vmovdqa64_avx512f(auVar7);
    input_00[1] = in_stack_fffffffffffffe00._0_8_;
    input_00[2] = in_stack_fffffffffffffe00._8_8_;
    input_00[3] = in_stack_fffffffffffffe00._16_8_;
    input_00[4] = in_stack_fffffffffffffe00._24_8_;
    input_00[0] = in_stack_fffffffffffffdf8;
    input_00[5] = (longlong)palVar4;
    input_00[6] = (longlong)__last;
    input_00[7] = (longlong)pcVar3;
    kernels::relu<signed_char>(input_00);
    local_240 = auVar7._0_56_;
    uVar9 = auVar7._56_8_;
    palVar4 = AlignedVector<signed_char>::as<long_long__vector(8)>(&local_78);
    auVar7._56_8_ = uVar9;
    auVar7._0_56_ = local_240;
    alVar1 = (longlong  [8])vmovdqa64_avx512f(auVar7);
    *palVar4 = alVar1;
    for (local_108 = 0; uVar2 = local_108, sVar5 = AlignedVector<signed_char>::size(&local_78),
        uVar2 < sVar5; local_108 = local_108 + 1) {
      local_160 = operator____catch_sr(auVar6._8_8_,auVar6._0_8_);
      Catch::SourceLineInfo::SourceLineInfo
                (&local_170,
                 "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/kernels/relu_test.cc"
                 ,0x19);
      Catch::StringRef::StringRef(auVar6._24_8_,auVar6._16_8_);
      Catch::AssertionHandler::AssertionHandler
                (auVar6._24_8_,auVar6._16_8_,auVar6._8_8_,auVar6._32_16_,auVar6._4_4_);
      AlignedVector<signed_char>::operator[](&local_78,local_108);
      Catch::Decomposer::operator<=(auVar6._0_8_,(char *)0x279c89);
      pcVar3 = AlignedVector<signed_char>::operator[](&local_68,local_108);
      if (-1 < *pcVar3) {
        AlignedVector<signed_char>::operator[](&local_68,local_108);
      }
      Catch::ExprLhs<signed_char_const&>::operator==(in_stack_fffffffffffffd40,auVar6._56_8_);
      Catch::AssertionHandler::handleExpr(auVar6._8_8_,auVar6._0_8_);
      Catch::BinaryExpr<const_signed_char_&,_const_int_&>::~BinaryExpr
                ((BinaryExpr<const_signed_char_&,_const_int_&> *)0x279d59);
      Catch::AssertionHandler::complete(auVar6._8_8_);
      Catch::AssertionHandler::~AssertionHandler(auVar6._8_8_);
    }
    AlignedVector<signed_char>::~AlignedVector((AlignedVector<signed_char> *)0x279e74);
    AlignedVector<signed_char>::~AlignedVector((AlignedVector<signed_char> *)0x279e81);
  }
  return;
}

Assistant:

void kernel_relu_test() {
  if (kCPU < CPUType_)
    return;

  using vec_t = vector_t<CPUType_, ElemType_>;
  constexpr int VECTOR_LENGTH = sizeof(vec_t) / sizeof(ElemType_);

  AlignedVector<ElemType_> input(VECTOR_LENGTH);
  AlignedVector<ElemType_> output(VECTOR_LENGTH);

  std::iota(input.begin(), input.end(), static_cast<ElemType_>(-VECTOR_LENGTH / 2));

  *output.template as<vec_t>() = kernels::relu<ElemType_>(*input.template as<vec_t>());
  for (std::size_t i = 0; i < output.size(); ++i)
    CHECK(output[i] == (input[i] < 0 ? 0 : input[i]));
}